

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitBinaryReference(ParseNode *pnode1,ParseNode *pnode2,ByteCodeGenerator *byteCodeGenerator,
                        FuncInfo *funcInfo,BOOL fLoadLhs)

{
  OpCode OVar1;
  ParseNode *pnode;
  BOOL BVar2;
  ParseNodeBin *pPVar3;
  BOOL fLoadLhs_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode2_local;
  ParseNode *pnode1_local;
  
  OVar1 = pnode1->nop;
  if (OVar1 == knopName) {
    if ((fLoadLhs != 0) &&
       (BVar2 = MayHaveSideEffectOnNode(pnode1,pnode2,byteCodeGenerator), BVar2 != 0)) {
      SaveOpndValue(pnode1,funcInfo);
    }
    goto LAB_00b50a30;
  }
  if (OVar1 == knopDot) {
    if (fLoadLhs != 0) {
      FuncInfo::AcquireLoc(funcInfo,pnode1);
    }
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    BVar2 = MayHaveSideEffectOnNode(pPVar3->pnode1,pnode2,byteCodeGenerator);
    if (BVar2 != 0) {
      pPVar3 = ParseNode::AsParseNodeBin(pnode1);
      SaveOpndValue(pPVar3->pnode1,funcInfo);
    }
    goto LAB_00b50a30;
  }
  if (OVar1 != knopIndex) goto LAB_00b50a30;
  if (fLoadLhs != 0) {
    FuncInfo::AcquireLoc(funcInfo,pnode1);
  }
  pPVar3 = ParseNode::AsParseNodeBin(pnode1);
  BVar2 = MayHaveSideEffectOnNode(pPVar3->pnode1,pnode2,byteCodeGenerator);
  if (BVar2 == 0) {
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    pnode = pPVar3->pnode1;
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    BVar2 = MayHaveSideEffectOnNode(pnode,pPVar3->pnode2,byteCodeGenerator);
    if (BVar2 != 0) goto LAB_00b509c5;
  }
  else {
LAB_00b509c5:
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    SaveOpndValue(pPVar3->pnode1,funcInfo);
  }
  pPVar3 = ParseNode::AsParseNodeBin(pnode1);
  BVar2 = MayHaveSideEffectOnNode(pPVar3->pnode2,pnode2,byteCodeGenerator);
  if (BVar2 != 0) {
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    FuncInfo::AcquireLoc(funcInfo,pPVar3->pnode1);
    pPVar3 = ParseNode::AsParseNodeBin(pnode1);
    SaveOpndValue(pPVar3->pnode2,funcInfo);
  }
LAB_00b50a30:
  if (fLoadLhs == 0) {
    EmitReference(pnode1,byteCodeGenerator,funcInfo);
  }
  else {
    EmitLoad(pnode1,byteCodeGenerator,funcInfo);
  }
  Emit(pnode2,byteCodeGenerator,funcInfo,0,false,false);
  return;
}

Assistant:

void EmitBinaryReference(ParseNode *pnode1, ParseNode *pnode2, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fLoadLhs)
{
    // Make sure that the RHS of an assignment doesn't kill the opnd's of the expression on the LHS.
    switch (pnode1->nop)
    {
    case knopName:
        if (fLoadLhs && MayHaveSideEffectOnNode(pnode1, pnode2, byteCodeGenerator))
        {
            // Given x op y, y may kill x, so stash x.
            // Note that this only matters if we're loading x prior to the op.
            SaveOpndValue(pnode1, funcInfo);
        }
        break;
    case knopDot:
        if (fLoadLhs)
        {
            // We're loading the value of the LHS before the RHS, so make sure the LHS gets a register first.
            funcInfo->AcquireLoc(pnode1);
        }
        if (MayHaveSideEffectOnNode(pnode1->AsParseNodeBin()->pnode1, pnode2, byteCodeGenerator))
        {
            // Given x.y op z, z may kill x, so stash x away.
            SaveOpndValue(pnode1->AsParseNodeBin()->pnode1, funcInfo);
        }
        break;
    case knopIndex:
        if (fLoadLhs)
        {
            // We're loading the value of the LHS before the RHS, so make sure the LHS gets a register first.
            funcInfo->AcquireLoc(pnode1);
        }
        if (MayHaveSideEffectOnNode(pnode1->AsParseNodeBin()->pnode1, pnode2, byteCodeGenerator) ||
            MayHaveSideEffectOnNode(pnode1->AsParseNodeBin()->pnode1, pnode1->AsParseNodeBin()->pnode2, byteCodeGenerator))
        {
            // Given x[y] op z, y or z may kill x, so stash x away.
            SaveOpndValue(pnode1->AsParseNodeBin()->pnode1, funcInfo);
        }
        if (MayHaveSideEffectOnNode(pnode1->AsParseNodeBin()->pnode2, pnode2, byteCodeGenerator))
        {
            // Given x[y] op z, z may kill y, so stash y away.
            // But make sure that x gets a register before y.
            funcInfo->AcquireLoc(pnode1->AsParseNodeBin()->pnode1);
            SaveOpndValue(pnode1->AsParseNodeBin()->pnode2, funcInfo);
        }
        break;
    }

    if (fLoadLhs)
    {
        // Emit code to load the value of the LHS.
        EmitLoad(pnode1, byteCodeGenerator, funcInfo);
    }
    else
    {
        // Emit code to evaluate the LHS opnds, but don't load the LHS's value.
        EmitReference(pnode1, byteCodeGenerator, funcInfo);
    }

    // Evaluate the RHS.
    Emit(pnode2, byteCodeGenerator, funcInfo, false);
}